

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

int oonf_layer2_neigh_generate_lid
              (oonf_layer2_neigh_key *key,oonf_layer2_origin *origin,netaddr *mac)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  uint8_t uVar6;
  long lVar7;
  int iVar8;
  undefined4 *puVar9;
  
  iVar8 = -1;
  if ((origin->lid == true) && ((byte)(mac->_type - 0x2f) < 2)) {
    lVar7 = avl_find(&_lid_tree,mac);
    if (lVar7 == 0) {
      puVar9 = (undefined4 *)oonf_class_malloc(&_lid_class);
      if (puVar9 == (undefined4 *)0x0) {
        return -1;
      }
      *(undefined2 *)(puVar9 + 4) = *(undefined2 *)&mac->_type;
      uVar2 = *(undefined4 *)(mac->_addr + 4);
      uVar3 = *(undefined4 *)(mac->_addr + 8);
      uVar4 = *(undefined4 *)(mac->_addr + 0xc);
      *puVar9 = *(undefined4 *)mac->_addr;
      puVar9[1] = uVar2;
      puVar9[2] = uVar3;
      puVar9[3] = uVar4;
      *(undefined4 **)(puVar9 + 0x10) = puVar9;
      avl_insert(&_lid_tree,puVar9 + 6);
      puVar9[5] = 1;
    }
    else {
      puVar9 = (undefined4 *)(lVar7 + -0x18);
    }
    *(undefined8 *)&(key->addr)._type = 0;
    key->link_id[5] = '\0';
    key->link_id[6] = '\0';
    key->link_id[7] = '\0';
    key->link_id[8] = '\0';
    key->link_id[9] = '\0';
    key->link_id[10] = '\0';
    key->link_id[0xb] = '\0';
    key->link_id[0xc] = '\0';
    key->link_id[0xc] = '\0';
    key->link_id[0xd] = '\0';
    key->link_id[0xe] = '\0';
    key->link_id[0xf] = '\0';
    (key->addr)._addr[0] = '\0';
    (key->addr)._addr[1] = '\0';
    (key->addr)._addr[2] = '\0';
    (key->addr)._addr[3] = '\0';
    (key->addr)._addr[4] = '\0';
    (key->addr)._addr[5] = '\0';
    (key->addr)._addr[6] = '\0';
    (key->addr)._addr[7] = '\0';
    (key->addr)._addr[8] = '\0';
    (key->addr)._addr[9] = '\0';
    (key->addr)._addr[10] = '\0';
    (key->addr)._addr[0xb] = '\0';
    (key->addr)._addr[0xc] = '\0';
    (key->addr)._addr[0xd] = '\0';
    (key->addr)._addr[0xe] = '\0';
    (key->addr)._addr[0xf] = '\0';
    uVar5 = *(undefined8 *)(mac->_addr + 8);
    *(undefined8 *)(key->addr)._addr = *(undefined8 *)mac->_addr;
    *(undefined8 *)((key->addr)._addr + 8) = uVar5;
    uVar6 = mac->_prefix_len;
    (key->addr)._type = mac->_type;
    (key->addr)._prefix_len = uVar6;
    uVar1 = puVar9[5];
    *(uint *)key->link_id =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    key->link_id_length = '\x04';
    key->link_id[0] = (uint8_t)origin->lid_index;
    puVar9[5] = puVar9[5] + 1;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int
oonf_layer2_neigh_generate_lid(struct oonf_layer2_neigh_key *key,
    struct oonf_layer2_origin *origin, const struct netaddr *mac) {
  struct oonf_layer2_lid *lid;
  uint32_t u32;

  if (!origin->lid) {
    return -1;
  }

  if (netaddr_get_address_family(mac) != AF_MAC48 && netaddr_get_address_family(mac) != AF_EUI64) {
    return -1;
  }

  if (!(lid = avl_find_element(&_lid_tree, mac, lid, _node))) {
    lid = oonf_class_malloc(&_lid_class);
    if (!lid) {
      return -1;
    }

    memcpy(&lid->mac, mac, sizeof(*mac));
    lid->_node.key = &lid->mac;
    avl_insert(&_lid_tree, &lid->_node);
    lid->next_id = 1;
  }

  memset(key, 0, sizeof(*key));

  /* copy mac */
  memcpy(&key->addr, mac, sizeof(*mac));

  /* TODO: make LID length configurable */

  /* generate new link-id */
  u32 = htonl(lid->next_id);
  memcpy(&key->link_id[0], &u32, 4);
  key->link_id_length = 4;

  /* keep track which originator orderer this LID */
  key->link_id[0] = origin->lid_index & 0xff;

  lid->next_id++;
  return 0;
}